

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

bool __thiscall TTD::ExecutionInfoManager::TryFindAndSetPreviousBP(ExecutionInfoManager *this)

{
  TTD_LOG_PTR_ID TVar1;
  
  TVar1 = (this->m_continueBreakPoint).m_sourceScriptLogId;
  if (TVar1 != 0) {
    TTDebuggerSourceLocation::SetLocationCopy(&this->m_pendingTTDBP,&this->m_continueBreakPoint);
    (this->m_continueBreakPoint).m_sourceScriptLogId = 0;
    *(undefined4 *)&(this->m_continueBreakPoint).m_bpId = 0xffffffff;
    *(undefined4 *)((long)&(this->m_continueBreakPoint).m_bpId + 4) = 0xffffffff;
    *(undefined4 *)&(this->m_continueBreakPoint).m_etime = 0xffffffff;
    *(undefined4 *)((long)&(this->m_continueBreakPoint).m_etime + 4) = 0xffffffff;
    (this->m_continueBreakPoint).m_ftime = 0;
    (this->m_continueBreakPoint).m_ltime = 0;
    (this->m_continueBreakPoint).m_topLevelBodyId = 0;
    (this->m_continueBreakPoint).m_functionLine = 0;
    (this->m_continueBreakPoint).m_functionColumn = 0;
    (this->m_continueBreakPoint).m_line = 0;
    (this->m_continueBreakPoint).m_column = 0;
  }
  return TVar1 != 0;
}

Assistant:

bool ExecutionInfoManager::TryFindAndSetPreviousBP()
    {
        if(!this->m_continueBreakPoint.HasValue())
        {
            return false;
        }
        else
        {
            this->m_pendingTTDBP.SetLocationCopy(this->m_continueBreakPoint);
            this->m_continueBreakPoint.Clear();

            return true;
        }
    }